

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O2

string_view __thiscall slang::ast::CoverageOptionSetter::getName(CoverageOptionSetter *this)

{
  ExpressionSyntax *pEVar1;
  int *piVar2;
  string_view sVar3;
  
  pEVar1 = (((this->syntax).ptr)->expr).ptr;
  if (((((pEVar1->super_SyntaxNode).kind == AssignmentExpression) &&
       (piVar2 = *(int **)&pEVar1[1].super_SyntaxNode, *piVar2 == 0x1a1)) &&
      (**(int **)(piVar2 + 6) == 0xe5)) && (**(int **)(piVar2 + 0xc) == 0xe5)) {
    sVar3 = parsing::Token::valueText((Token *)(*(int **)(piVar2 + 0xc) + 6));
    return sVar3;
  }
  return (string_view)(ZEXT816(0x401ea3) << 0x40);
}

Assistant:

constexpr T get() const {
        SLANG_ASSERT(ptr);
        return ptr;
    }